

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall StaticTaintAnalysisPass::initTaintSource(StaticTaintAnalysisPass *this,Module *M)

{
  bool bVar1;
  Module *pMVar2;
  Module *pMVar3;
  Module *pMVar4;
  Module *pMVar5;
  Module *pMVar6;
  Module *ins;
  Instruction *local_38;
  
  for (pMVar2 = M + 0x20; pMVar2 = *(Module **)pMVar2, pMVar2 != M + 0x18; pMVar2 = pMVar2 + 8) {
    pMVar3 = pMVar2 + -0x38;
    if (pMVar2 == (Module *)0x0) {
      pMVar3 = (Module *)0x0;
    }
    for (pMVar5 = pMVar3 + 0x50; pMVar5 = *(Module **)pMVar5, pMVar5 != pMVar3 + 0x48;
        pMVar5 = pMVar5 + 8) {
      pMVar4 = pMVar5 + -0x18;
      if (pMVar5 == (Module *)0x0) {
        pMVar4 = (Module *)0x0;
      }
      for (pMVar6 = pMVar4 + 0x30; pMVar6 = *(Module **)pMVar6, pMVar6 != pMVar4 + 0x28;
          pMVar6 = pMVar6 + 8) {
        ins = pMVar6 + -0x18;
        if (pMVar6 == (Module *)0x0) {
          ins = (Module *)0x0;
        }
        bVar1 = isTaintSource(this,(Instruction *)ins);
        if (bVar1) {
          local_38 = (Instruction *)ins;
          std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
                    ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)&this->taintSource,
                     (Value **)&local_38);
        }
      }
    }
  }
  return;
}

Assistant:

void
StaticTaintAnalysisPass::initTaintSource(Module& M) {
    for ( auto pF = M.begin(); pF != M.end() ; ++ pF )  {
        for ( auto pB = pF->begin(); pB != pF->end(); ++pB ) {
            for ( auto pI = pB->begin(); pI != pB->end(); ++pI) {
                Instruction *pi = &(*pI) ;
                if ( isTaintSource(pi) ) {
                    taintSource.push_back(pi);
                }
            }       
        }
    }
}